

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int scheduler_can_send(quicly_conn_t *conn)

{
  st_quicly_stream_scheduler_t *psVar1;
  int iVar2;
  
  if ((((conn->super).state & ~QUICLY_STATE_CONNECTED) == QUICLY_STATE_FIRSTFLIGHT) &&
     (conn->application != (st_quicly_application_space_t *)0x0)) {
    psVar1 = ((conn->super).ctx)->stream_scheduler;
    iVar2 = (*psVar1->can_send)(psVar1,conn,
                                SUB14((conn->egress).max_data.permitted <=
                                      (conn->egress).max_data.sent,0));
    return iVar2;
  }
  return 0;
}

Assistant:

static int scheduler_can_send(quicly_conn_t *conn)
{
    /* invoke the scheduler only when we are able to send stream data; skipping STATE_ACCEPTING is important as the application
     * would not have setup data pointer. */
    switch (conn->super.state) {
    case QUICLY_STATE_FIRSTFLIGHT:
    case QUICLY_STATE_CONNECTED:
        break;
    default:
        return 0;
    }

    /* scheduler would never have data to send, until application keys become available */
    if (conn->application == NULL)
        return 0;

    int conn_is_saturated = !(conn->egress.max_data.sent < conn->egress.max_data.permitted);
    return conn->super.ctx->stream_scheduler->can_send(conn->super.ctx->stream_scheduler, conn, conn_is_saturated);
}